

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyLink.h
# Opt level: O0

void __thiscall btMultibodyLink::updateCacheMultiDof(btMultibodyLink *this,btScalar *pq)

{
  undefined8 uVar1;
  btQuaternion *q1;
  btScalar *in_RSI;
  btMultibodyLink *in_RDI;
  btQuaternion bVar2;
  btVector3 bVar3;
  btScalar *pJointPos;
  btVector3 *in_stack_fffffffffffffdc8;
  btScalar *in_stack_fffffffffffffdd0;
  btVector3 *in_stack_fffffffffffffdd8;
  btVector3 *_axis;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  int dof;
  btVector3 *in_stack_fffffffffffffdf8;
  btQuaternion *in_stack_fffffffffffffe00;
  btScalar *rotation;
  btQuaternion *in_stack_fffffffffffffe48;
  btScalar *local_1a8;
  btVector3 local_100;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  btScalar local_c0;
  undefined8 local_ac;
  undefined8 uStack_a4;
  undefined8 local_9c;
  undefined8 local_94;
  undefined8 local_8c;
  undefined8 local_84;
  undefined8 local_7c;
  undefined8 local_74;
  undefined8 local_5c;
  undefined8 local_54;
  btScalar local_3c;
  undefined8 local_28;
  undefined8 uStack_20;
  btScalar *local_18;
  
  local_1a8 = in_RSI;
  if (in_RSI == (btScalar *)0x0) {
    local_1a8 = in_RDI->m_jointPos;
  }
  local_18 = local_1a8;
  q1 = (btQuaternion *)(ulong)in_RDI->m_jointType;
  switch(q1) {
  case (btQuaternion *)0x0:
    getAxisTop(in_RDI,0);
    local_3c = -*local_18;
    btQuaternion::btQuaternion
              ((btQuaternion *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    bVar2 = ::operator*(q1,in_stack_fffffffffffffe48);
    local_28 = bVar2.super_btQuadWord.m_floats._0_8_;
    uStack_20 = bVar2.super_btQuadWord.m_floats._8_8_;
    *(undefined8 *)(in_RDI->m_cachedRotParentToThis).super_btQuadWord.m_floats = local_28;
    *(undefined8 *)((in_RDI->m_cachedRotParentToThis).super_btQuadWord.m_floats + 2) = uStack_20;
    bVar3 = quatRotate(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    local_5c = bVar3.m_floats._0_8_;
    local_54 = bVar3.m_floats._8_8_;
    bVar3 = operator+((btVector3 *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                      in_stack_fffffffffffffdd8);
    *(long *)(in_RDI->m_cachedRVector).m_floats = bVar3.m_floats._0_8_;
    *(long *)((in_RDI->m_cachedRVector).m_floats + 2) = bVar3.m_floats._8_8_;
    break;
  case (btQuaternion *)0x1:
    bVar3 = quatRotate(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    local_8c = bVar3.m_floats._0_8_;
    local_84 = bVar3.m_floats._8_8_;
    bVar3 = operator+((btVector3 *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                      in_stack_fffffffffffffdd8);
    local_7c = bVar3.m_floats._0_8_;
    local_74 = bVar3.m_floats._8_8_;
    getAxisBottom(in_RDI,0);
    bVar3 = ::operator*(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    local_9c = bVar3.m_floats._0_8_;
    local_94 = bVar3.m_floats._8_8_;
    bVar3 = operator+((btVector3 *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                      in_stack_fffffffffffffdd8);
    *(long *)(in_RDI->m_cachedRVector).m_floats = bVar3.m_floats._0_8_;
    *(long *)((in_RDI->m_cachedRVector).m_floats + 2) = bVar3.m_floats._8_8_;
    break;
  case (btQuaternion *)0x2:
    local_c0 = -local_1a8[3];
    btQuaternion::btQuaternion
              ((btQuaternion *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffdd8->m_floats,in_stack_fffffffffffffdd0,
               in_stack_fffffffffffffdc8->m_floats,(btScalar *)0x2444a6);
    bVar2 = ::operator*(q1,in_stack_fffffffffffffe48);
    local_ac = bVar2.super_btQuadWord.m_floats._0_8_;
    uStack_a4 = bVar2.super_btQuadWord.m_floats._8_8_;
    *(undefined8 *)(in_RDI->m_cachedRotParentToThis).super_btQuadWord.m_floats = local_ac;
    *(undefined8 *)((in_RDI->m_cachedRotParentToThis).super_btQuadWord.m_floats + 2) = uStack_a4;
    bVar3 = quatRotate(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    local_e0 = bVar3.m_floats._0_8_;
    local_d8 = bVar3.m_floats._8_8_;
    bVar3 = operator+((btVector3 *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                      in_stack_fffffffffffffdd8);
    *(long *)(in_RDI->m_cachedRVector).m_floats = bVar3.m_floats._0_8_;
    *(long *)((in_RDI->m_cachedRVector).m_floats + 2) = bVar3.m_floats._8_8_;
    break;
  case (btQuaternion *)0x3:
    dof = 0;
    getAxisTop(in_RDI,0);
    _axis = &local_100;
    btQuaternion::btQuaternion
              ((btQuaternion *)CONCAT44(dof,in_stack_fffffffffffffde0),_axis,
               in_stack_fffffffffffffdd0);
    bVar2 = ::operator*(q1,in_stack_fffffffffffffe48);
    local_f0 = bVar2.super_btQuadWord.m_floats._0_8_;
    uStack_e8 = bVar2.super_btQuadWord.m_floats._8_8_;
    *(undefined8 *)(in_RDI->m_cachedRotParentToThis).super_btQuadWord.m_floats = local_f0;
    *(undefined8 *)((in_RDI->m_cachedRotParentToThis).super_btQuadWord.m_floats + 2) = uStack_e8;
    getAxisTop(in_RDI,dof);
    btQuaternion::btQuaternion
              ((btQuaternion *)CONCAT44(dof,in_stack_fffffffffffffde0),_axis,
               in_stack_fffffffffffffdd0);
    rotation = local_18 + 1;
    getAxisBottom(in_RDI,1);
    ::operator*(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    getAxisBottom(in_RDI,2);
    ::operator*(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    operator+((btVector3 *)CONCAT44(dof,in_stack_fffffffffffffde0),_axis);
    quatRotate((btQuaternion *)rotation,in_stack_fffffffffffffdf8);
    quatRotate((btQuaternion *)rotation,in_stack_fffffffffffffdf8);
    bVar3 = operator+((btVector3 *)CONCAT44(dof,in_stack_fffffffffffffde0),_axis);
    *(long *)(in_RDI->m_cachedRVector).m_floats = bVar3.m_floats._0_8_;
    *(long *)((in_RDI->m_cachedRVector).m_floats + 2) = bVar3.m_floats._8_8_;
    break;
  case (btQuaternion *)0x4:
    uVar1 = *(undefined8 *)((in_RDI->m_zeroRotParentToThis).super_btQuadWord.m_floats + 2);
    *(undefined8 *)(in_RDI->m_cachedRotParentToThis).super_btQuadWord.m_floats =
         *(undefined8 *)(in_RDI->m_zeroRotParentToThis).super_btQuadWord.m_floats;
    *(undefined8 *)((in_RDI->m_cachedRotParentToThis).super_btQuadWord.m_floats + 2) = uVar1;
    quatRotate(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    bVar3 = operator+((btVector3 *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                      in_stack_fffffffffffffdd8);
    *(long *)(in_RDI->m_cachedRVector).m_floats = bVar3.m_floats._0_8_;
    *(long *)((in_RDI->m_cachedRVector).m_floats + 2) = bVar3.m_floats._8_8_;
  }
  return;
}

Assistant:

void updateCacheMultiDof(btScalar *pq = 0)
	{
		btScalar *pJointPos = (pq ? pq : &m_jointPos[0]);

		switch(m_jointType)
		{
			case eRevolute:
			{
				m_cachedRotParentToThis = btQuaternion(getAxisTop(0),-pJointPos[0]) * m_zeroRotParentToThis;
				m_cachedRVector = m_dVector + quatRotate(m_cachedRotParentToThis,m_eVector);

				break;
			}
			case ePrismatic:
			{
				// m_cachedRotParentToThis never changes, so no need to update
				m_cachedRVector = m_dVector + quatRotate(m_cachedRotParentToThis,m_eVector) + pJointPos[0] * getAxisBottom(0);

				break;
			}
			case eSpherical:
			{
				m_cachedRotParentToThis = btQuaternion(pJointPos[0], pJointPos[1], pJointPos[2], -pJointPos[3]) * m_zeroRotParentToThis;
				m_cachedRVector = m_dVector + quatRotate(m_cachedRotParentToThis,m_eVector);

				break;
			}
			case ePlanar:
			{
				m_cachedRotParentToThis = btQuaternion(getAxisTop(0),-pJointPos[0]) * m_zeroRotParentToThis;				
				m_cachedRVector = quatRotate(btQuaternion(getAxisTop(0),-pJointPos[0]), pJointPos[1] * getAxisBottom(1) + pJointPos[2] * getAxisBottom(2)) + quatRotate(m_cachedRotParentToThis,m_eVector);				

				break;
			}
			case eFixed:
			{
				m_cachedRotParentToThis = m_zeroRotParentToThis;
				m_cachedRVector = m_dVector + quatRotate(m_cachedRotParentToThis,m_eVector);

				break;
			}
			default:
			{
				//invalid type
				btAssert(0);
			}
		}
	}